

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::PatchableProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint cacheId,bool isCtor,
          bool registerCacheIdForCall)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  RegSlot instance_00;
  undefined4 *puVar3;
  bool success;
  CacheIdUnit unit_1;
  CacheIdUnit unit;
  ProfileId profileId;
  bool isProfiled;
  bool registerCacheIdForCall_local;
  bool isCtor_local;
  uint cacheId_local;
  RegSlot instance_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  cacheId_local = value;
  instance_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = instance_local._2_2_;
  OpLayoutType::OpLayoutType((OpLayoutType *)&unit.isRootObjectCache,ElementCP);
  CheckOp(this,op_00,(OpLayoutType)unit._4_4_);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(instance_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x82b,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  cacheId_local = ConsumeReg(this,cacheId_local);
  instance_00 = ConsumeReg(this,instance);
  unit.cacheId._3_1_ = 0;
  unit.cacheId._0_2_ = 0xffff;
  switch(instance_local._2_2_) {
  case InitLetFld:
  case InitConstFld:
  case InitClassMember:
  case ScopedLdMethodFld:
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x873,"(false)",
                                "The specified OpCode is not intended for patchable field-access");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    break;
  case LdFld:
  case LdFld_ReuseLoc:
  case LdFldForTypeOf:
    if ((isCtor) && (registerCacheIdForCall)) {
      CacheIdUnit::CacheIdUnit(&unit_1,cacheId,false);
      bVar2 = JsUtil::
              BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>(this->callRegToLdFldCacheIndexMap,&cacheId_local,&unit_1);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x84d,
                                    "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))",
                                    "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      JsUtil::
      BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(this->callRegToLdFldCacheIndexMap,&cacheId_local,&unit_1);
    }
  case LdFldForCallApplyTarget:
    bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
    if ((((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false), bVar2)) ||
        (bVar2 = DoDynamicProfileOpcode(this,ObjTypeSpecPhase,false), bVar2)) ||
       ((bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar2 ||
        (bVar2 = DoDynamicProfileOpcode(this,ProfileBasedFldFastPathPhase,false), bVar2)))) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&instance_local + 2));
    }
    break;
  case LdMethodFld:
    if (registerCacheIdForCall) {
      CacheIdUnit::CacheIdUnit((CacheIdUnit *)&stack0xffffffffffffffc4,cacheId,false);
      bVar2 = JsUtil::
              BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        (this->callRegToLdFldCacheIndexMap,&cacheId_local,
                         (CacheIdUnit *)&stack0xffffffffffffffc4);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x85f,
                                    "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))",
                                    "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      JsUtil::
      BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(this->callRegToLdFldCacheIndexMap,&cacheId_local,(CacheIdUnit *)&stack0xffffffffffffffc4
           );
    }
  case StFld:
  case StFldStrict:
  case InitFld:
    bVar2 = DoDynamicProfileOpcode(this,ProfileBasedFldFastPathPhase,false);
    if (((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar2)) ||
       (bVar2 = DoDynamicProfileOpcode(this,ObjTypeSpecPhase,false), bVar2)) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&instance_local + 2));
    }
    break;
  case LdLen_A:
    bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
    if ((((((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false), bVar2)) ||
          (bVar2 = DoDynamicProfileOpcode(this,TypedArrayTypeSpecPhase,false), bVar2)) ||
         ((bVar2 = DoDynamicProfileOpcode(this,ArrayCheckHoistPhase,false), bVar2 ||
          (bVar2 = DoDynamicProfileOpcode(this,ObjTypeSpecPhase,false), bVar2)))) ||
        ((bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), bVar2 ||
         (bVar2 = DoDynamicProfileOpcode(this,ProfileBasedFldFastPathPhase,false), bVar2)))) &&
       (bVar2 = FunctionBody::AllocProfiledLdLenId(this->m_functionWrite,(ProfileId *)&unit), bVar2)
       ) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&instance_local + 2));
      unit.cacheId._3_1_ = 1;
    }
  }
  bVar2 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,instance_local._2_2_,cacheId_local,instance_00,cacheId);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,instance_local._2_2_,cacheId_local,instance_00,cacheId), !bVar2)) &&
     (bVar2 = TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,instance_local._2_2_,cacheId_local,instance_00,cacheId), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x877,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((unit.cacheId._3_1_ & 1) != 0) {
    Data::Encode(&this->m_byteCodeData,&unit,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::PatchableProperty(OpCode op, RegSlot value, RegSlot instance, uint cacheId, bool isCtor, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementCP);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

        bool isProfiled = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;

        switch (op)
        {
        case OpCode::LdLen_A:
        {
            if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
                DoDynamicProfileOpcode(ArrayCheckHoistPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
                && this->m_functionWrite->AllocProfiledLdLenId(&profileId))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
                isProfiled = true;
            }
            break;
        }
        case OpCode::LdFldForTypeOf:
        case OpCode::LdFld:
        case OpCode::LdFld_ReuseLoc:
            if (isCtor) // The symbol loaded by this LdFld will be used as a constructor
            {
                if (registerCacheIdForCall)
                {
                    CacheIdUnit unit(cacheId);
                    Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                    callRegToLdFldCacheIndexMap->Add(value, unit);
                }
            }
        case OpCode::LdFldForCallApplyTarget:
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::LdMethodFld:
            if (registerCacheIdForCall)
            {
                CacheIdUnit unit(cacheId);
                Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                callRegToLdFldCacheIndexMap->Add(value, unit);
            }
            // fall-through
        case OpCode::StFld:
        case OpCode::StFldStrict:
        case OpCode::InitFld:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::InitLetFld:
        case OpCode::InitConstFld:
        case OpCode::InitClassMember:
        case OpCode::ScopedLdMethodFld:
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementCP, op, value, instance, cacheId);

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }